

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

AsmJsFunctionInfo * __thiscall Js::FunctionBody::AllocateAsmJsFunctionInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  AsmJsFunctionInfo *pAVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pAVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                     ((FunctionProxy *)this);
  if (pAVar3 != (AsmJsFunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x198f,"(!this->GetAsmJsFunctionInfo())",
                                "!this->GetAsmJsFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_40 = (undefined1  [8])&AsmJsFunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x1990;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_40);
  pAVar3 = (AsmJsFunctionInfo *)new<Memory::Recycler>(0xd0,alloc,0x37a1d4);
  AsmJsFunctionInfo::AsmJsFunctionInfo(pAVar3);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
            ((FunctionProxy *)this,pAVar3);
  pAVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                     ((FunctionProxy *)this);
  return pAVar3;
}

Assistant:

AsmJsFunctionInfo* FunctionBody::AllocateAsmJsFunctionInfo()
    {
        Assert( !this->GetAsmJsFunctionInfo() );
        this->SetAuxPtr<AuxPointerType::AsmJsFunctionInfo>(RecyclerNew( m_scriptContext->GetRecycler(), AsmJsFunctionInfo));
        return this->GetAsmJsFunctionInfo();
    }